

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O0

status_t tchecker::dbm::constrain
                   (db_t *dbm,clock_id_t dim,clock_constraint_container_t *constraints)

{
  bool bVar1;
  status_t sVar2;
  reference c_00;
  clock_constraint_t *c;
  const_iterator __end2;
  const_iterator __begin2;
  clock_constraint_container_t *__range2;
  clock_constraint_container_t *constraints_local;
  clock_id_t dim_local;
  db_t *dbm_local;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x107,
                  "enum tchecker::dbm::status_t tchecker::dbm::constrain(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::clock_constraint_container_t &)"
                 );
  }
  if (dim == 0) {
    __assert_fail("dim >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x108,
                  "enum tchecker::dbm::status_t tchecker::dbm::constrain(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::clock_constraint_container_t &)"
                 );
  }
  bVar1 = is_consistent(dbm,dim);
  if (!bVar1) {
    __assert_fail("tchecker::dbm::is_consistent(dbm, dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x109,
                  "enum tchecker::dbm::status_t tchecker::dbm::constrain(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::clock_constraint_container_t &)"
                 );
  }
  bVar1 = is_tight(dbm,dim);
  if (bVar1) {
    __end2 = std::
             vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::
             begin(constraints);
    c = (clock_constraint_t *)
        std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::
        end(constraints);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
                                  *)&c);
      if (!bVar1) {
        return NON_EMPTY;
      }
      c_00 = __gnu_cxx::
             __normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
             ::operator*(&__end2);
      sVar2 = constrain(dbm,dim,c_00);
      if (sVar2 == EMPTY) break;
      __gnu_cxx::
      __normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
      ::operator++(&__end2);
    }
    return EMPTY;
  }
  __assert_fail("tchecker::dbm::is_tight(dbm, dim)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,0x10a,
                "enum tchecker::dbm::status_t tchecker::dbm::constrain(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::clock_constraint_container_t &)"
               );
}

Assistant:

enum tchecker::dbm::status_t constrain(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim,
                                       tchecker::clock_constraint_container_t const & constraints)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  assert(tchecker::dbm::is_consistent(dbm, dim));
  assert(tchecker::dbm::is_tight(dbm, dim));

  for (tchecker::clock_constraint_t const & c : constraints) {
    if (tchecker::dbm::constrain(dbm, dim, c) == tchecker::dbm::EMPTY)
      return tchecker::dbm::EMPTY;
  }
  return tchecker::dbm::NON_EMPTY;
}